

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

bool DoRadiusGive(AActor *self,AActor *thing,PClassActor *item,int amount,double distance,int flags,
                 PClassActor *filter,FName *species,double mindist)

{
  byte *pbVar1;
  player_t *ppVar2;
  uint uVar3;
  undefined1 uVar4;
  int iVar5;
  undefined4 extraout_var;
  PClassActor *pPVar7;
  AActor *pAVar8;
  AInventory *this;
  PClass *pPVar9;
  AActor *pAVar10;
  AActor *pAVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  FName actorSpecies;
  DVector3 diff;
  undefined1 local_68 [32];
  DVector3 local_48;
  PClass *pPVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pPVar9 = AInventory::RegistrationInfo.MyClass;
  if (thing == self) {
    uVar3 = flags & 1;
joined_r0x003de5be:
    if (uVar3 == 0) {
      return false;
    }
  }
  else {
    if (((thing->flags).Value & 0x10000) != 0) {
      uVar3 = (uint)flags >> 0xb & 1;
      goto joined_r0x003de5be;
    }
    if (((uint)flags >> 0xd & 1) == 0) {
LAB_003de549:
      if ((((flags & 0x20U) == 0) || (((thing->flags).Value & 0x100000) == 0)) &&
         ((((uint)flags >> 0xe & 1) == 0 || (((thing->flags6).Value & 0x40000) == 0)))) {
        if ((flags & 0x1eU) == 0) {
          return false;
        }
        if (thing->health < 1) {
          return false;
        }
        ppVar2 = thing->player;
        if (ppVar2 == (player_t *)0x0) {
          if (((flags & 4U) == 0) || (((thing->flags3).Value & 0x2000) == 0)) {
            if ((flags & 8U) == 0) {
              return false;
            }
            if (((thing->flags3).Value & 0x2000) != 0) {
              return false;
            }
            if ((((thing->flags).Value & 4) == 0) && (((thing->flags6).Value & 0x1000) == 0)) {
              return false;
            }
          }
        }
        else if (((flags & 2U) == 0) || (ppVar2->mo != (APlayerPawn *)thing)) {
          if ((flags & 0x10U) == 0) {
            return false;
          }
          if (ppVar2->mo == (APlayerPawn *)thing) {
            return false;
          }
        }
      }
    }
    else {
      pPVar6 = (thing->super_DThinker).super_DObject.Class;
      if (pPVar6 == (PClass *)0x0) {
        iVar5 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
        pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
        (thing->super_DThinker).super_DObject.Class = pPVar6;
      }
      bVar13 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar9 && bVar13) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar13 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar9) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar13) goto LAB_003de549;
    }
  }
  pPVar7 = (PClassActor *)(thing->super_DThinker).super_DObject.Class;
  if (pPVar7 == (PClassActor *)0x0) {
    iVar5 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
    pPVar7 = (PClassActor *)CONCAT44(extraout_var_00,iVar5);
    (thing->super_DThinker).super_DObject.Class = (PClass *)pPVar7;
  }
  iVar5 = species->Index;
  AActor::GetSpecies((AActor *)local_68);
  if (iVar5 == 0) {
    bVar13 = true;
  }
  else if (((uint)flags >> 0x10 & 1) == 0) {
    bVar13 = local_68._0_4_ == iVar5;
  }
  else {
    bVar13 = local_68._0_4_ != iVar5;
  }
  bVar12 = filter == (PClassActor *)0x0 || (pPVar7 == filter) != (short)flags < 0;
  if (((uint)flags >> 0x11 & 1) == 0) {
    if (thing != self) {
      uVar4 = bVar12 & bVar13;
joined_r0x003de662:
      if (!(bool)uVar4) {
        return false;
      }
    }
  }
  else if (thing != self) {
    uVar4 = bVar12 | bVar13;
    goto joined_r0x003de662;
  }
  if ((flags & 0x1c0U) == 0 || thing == self) goto LAB_003de680;
  pAVar8 = (self->target).field_0.p;
  if (pAVar8 == (AActor *)0x0) {
LAB_003de736:
    pAVar8 = (AActor *)0x0;
  }
  else if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    goto LAB_003de736;
  }
  bVar13 = (flags & 0x40U) != 0;
  pAVar10 = (self->master).field_0.p;
  if (pAVar10 == (AActor *)0x0) {
LAB_003de762:
    pAVar10 = (AActor *)0x0;
  }
  else if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->master).field_0.p = (AActor *)0x0;
    goto LAB_003de762;
  }
  bVar12 = ((uint)flags >> 8 & 1) != 0;
  pAVar11 = (self->tracer).field_0.p;
  if (pAVar11 == (AActor *)0x0) {
LAB_003de790:
    pAVar11 = (AActor *)0x0;
  }
  else if (((pAVar11->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->tracer).field_0.p = (AActor *)0x0;
    goto LAB_003de790;
  }
  bVar14 = (char)flags < '\0';
  if (((uint)flags >> 0xc & 1) == 0) {
    if (bVar13 && pAVar8 == thing || (bVar12 && pAVar10 == thing || bVar14 && pAVar11 == thing)) {
      return false;
    }
  }
  else if ((bVar13 && pAVar8 == thing) &&
           ((bVar12 && pAVar10 == thing) && (bVar14 && pAVar11 == thing))) {
    return false;
  }
LAB_003de680:
  AActor::Vec3To(&local_48,self,thing);
  local_48.Z = thing->Height * 0.5 + local_48.Z;
  if (((uint)flags >> 9 & 1) == 0) {
    dVar15 = local_48.Z * local_48.Z + local_48.Y * local_48.Y + local_48.X * local_48.X;
    if (distance * distance < dVar15) {
      return false;
    }
    if (((mindist != 0.0) || (NAN(mindist))) && (dVar15 < mindist * mindist)) {
      return false;
    }
  }
  else {
    if (distance < ABS(local_48.X)) {
      return false;
    }
    if (distance < ABS(local_48.Y)) {
      return false;
    }
    if (distance < ABS(local_48.Z)) {
      return false;
    }
    if ((((mindist != 0.0) || (NAN(mindist))) && (ABS(local_48.X) < mindist)) &&
       ((ABS(local_48.Y) < mindist && (ABS(local_48.Z) < mindist)))) {
      return false;
    }
  }
  if ((((uint)flags >> 10 & 1) != 0) || (bVar13 = P_CheckSight(thing,self,9), bVar13)) {
    local_68._0_8_ = (_func_int **)0x0;
    local_68._8_8_ = (PClass *)0x0;
    local_68._16_8_ = (DObject *)0x0;
    this = (AInventory *)AActor::StaticSpawn(item,(DVector3 *)local_68,NO_REPLACE,false);
    pPVar6 = AHealth::RegistrationInfo.MyClass;
    pPVar9 = (this->super_AActor).super_DThinker.super_DObject.Class;
    if (pPVar9 == (PClass *)0x0) {
      iVar5 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
      pPVar9 = (PClass *)CONCAT44(extraout_var_01,iVar5);
      (this->super_AActor).super_DThinker.super_DObject.Class = pPVar9;
    }
    bVar13 = pPVar9 != (PClass *)0x0;
    if (pPVar9 != pPVar6 && bVar13) {
      do {
        pPVar9 = pPVar9->ParentClass;
        bVar13 = pPVar9 != (PClass *)0x0;
        if (pPVar9 == pPVar6) break;
      } while (pPVar9 != (PClass *)0x0);
    }
    if (bVar13) {
      amount = amount * this->Amount;
    }
    this->Amount = amount;
    pbVar1 = (byte *)((long)&(this->super_AActor).flags.Value + 2);
    *pbVar1 = *pbVar1 | 2;
    AActor::ClearCounters((AActor *)this);
    bVar13 = AInventory::CallTryPickup(this,thing,(AActor **)0x0);
    if (bVar13) {
      return true;
    }
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
  }
  return false;
}

Assistant:

static bool DoRadiusGive(AActor *self, AActor *thing, PClassActor *item, int amount, double distance, int flags, PClassActor *filter, FName species, double mindist)
{
	
	bool doPass = false;
	// Always allow self to give, no matter what other flags are specified. Otherwise, not at all.
	if (thing == self)
	{
		if (!(flags & RGF_GIVESELF))
			return false;
		doPass = true;
	}
	else if (thing->flags & MF_MISSILE)
	{
		if (!(flags & RGF_MISSILES))
			return false;
		doPass = true;
	}
	else if (((flags & RGF_ITEMS) && thing->IsKindOf(RUNTIME_CLASS(AInventory))) ||
			((flags & RGF_CORPSES) && thing->flags & MF_CORPSE) ||
			((flags & RGF_KILLED) && thing->flags6 & MF6_KILLED))
	{
		doPass = true;
	}
	else if ((flags & (RGF_MONSTERS | RGF_OBJECTS | RGF_PLAYERS | RGF_VOODOO)))
	{
		// Make sure it's alive as we're not looking for corpses or killed here.
		if (!doPass && thing->health > 0)
		{
			if (thing->player != nullptr)
			{
				if (((flags & RGF_PLAYERS) && (thing->player->mo == thing)) ||
					((flags & RGF_VOODOO) && (thing->player->mo != thing)))
				{
					doPass = true;
				}
			}
			else
			{
				if (((flags & RGF_MONSTERS) && (thing->flags3 & MF3_ISMONSTER)) ||
					((flags & RGF_OBJECTS) && (!(thing->flags3 & MF3_ISMONSTER)) &&
					(thing->flags & MF_SHOOTABLE || thing->flags6 & MF6_VULNERABLE)))
				{
					doPass = true;
				}
			}
		}
	}

	// Nothing matched up so don't bother with the rest.
	if (!doPass)
		return false;

	//[MC] Check for a filter, species, and the related exfilter/expecies/either flag(s).
	bool filterpass = DoCheckClass(thing, filter, !!(flags & RGF_EXFILTER)),
		speciespass = DoCheckSpecies(thing, species, !!(flags & RGF_EXSPECIES));

	if ((flags & RGF_EITHER) ? (!(filterpass || speciespass)) : (!(filterpass && speciespass)))
	{
		if (thing != self)      //Don't let filter and species obstruct RGF_GIVESELF.
			return false;
	}

	if ((thing != self) && (flags & (RGF_NOTARGET | RGF_NOMASTER | RGF_NOTRACER)))
	{
		//Check for target, master, and tracer flagging.
		bool targetPass = true;
		bool masterPass = true;
		bool tracerPass = true;
		bool ptrPass = false;

		if ((thing == self->target) && (flags & RGF_NOTARGET))
			targetPass = false;
		if ((thing == self->master) && (flags & RGF_NOMASTER))
			masterPass = false;
		if ((thing == self->tracer) && (flags & RGF_NOTRACER))
			tracerPass = false;

		ptrPass = (flags & RGF_INCLUSIVE) ? (targetPass || masterPass || tracerPass) : (targetPass && masterPass && tracerPass);

		//We should not care about what the actor is here. It's safe to abort this actor.
		if (!ptrPass)
			return false;
	}

	if (doPass)
	{
		DVector3 diff = self->Vec3To(thing);
		diff.Z += thing->Height *0.5;
		if (flags & RGF_CUBE)
		{ // check if inside a cube
			double dx = fabs(diff.X);
			double dy = fabs(diff.Y);
			double dz = fabs(diff.Z);
			if ((dx > distance || dy > distance || dz > distance) || (mindist && (dx < mindist && dy < mindist && dz < mindist)))
			{
				return false;
			}
		}
		else
		{ // check if inside a sphere
			double lengthsquared = diff.LengthSquared();
			if (lengthsquared > distance*distance || (mindist && (lengthsquared < mindist*mindist)))
			{
				return false;
			}
		}

		if ((flags & RGF_NOSIGHT) || P_CheckSight(thing, self, SF_IGNOREVISIBILITY | SF_IGNOREWATERBOUNDARY))
		{ // OK to give; target is in direct path, or the monster doesn't care about it being in line of sight.
			AInventory *gift = static_cast<AInventory *>(Spawn(item));
			if (gift->IsKindOf(RUNTIME_CLASS(AHealth)))
			{
				gift->Amount *= amount;
			}
			else
			{
				gift->Amount = amount;
			}
			gift->flags |= MF_DROPPED;
			gift->ClearCounters();
			if (!gift->CallTryPickup(thing))
			{
				gift->Destroy();
				return false;
			}
			else
			{
				return true;
			}
		}
	}
	return false;
}